

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

SizeAlignment __thiscall
dxil_spv::Converter::Impl::get_physical_size_for_type(Impl *this,Id type_id)

{
  Op OVar1;
  uint uVar2;
  int iVar3;
  Id IVar4;
  uint uVar5;
  Builder *pBVar6;
  SizeAlignment SVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint32_t uVar11;
  int member;
  
  pBVar6 = builder(this);
  OVar1 = (pBVar6->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start[type_id]->opCode;
  pBVar6 = builder(this);
  if (OVar1 - OpTypeBool < 3) {
    iVar3 = spv::Builder::getScalarTypeWidth(pBVar6,type_id);
    uVar9 = (long)iVar3 / 8 & 0xffffffff;
LAB_0011592a:
    uVar5 = (uint)uVar9;
  }
  else {
    OVar1 = (pBVar6->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start[type_id]->opCode;
    pBVar6 = builder(this);
    if (OVar1 == OpTypeVector) {
      IVar4 = spv::Builder::getContainedTypeId(pBVar6,type_id);
      SVar7 = get_physical_size_for_type(this,IVar4);
      uVar11 = SVar7.size;
      pBVar6 = builder(this);
      iVar3 = spv::Builder::getNumComponents(pBVar6,type_id);
    }
    else {
      OVar1 = (pBVar6->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start[type_id]->opCode;
      pBVar6 = builder(this);
      if ((OVar1 & ~OpUndef) != OpTypeArray) {
        OVar1 = (pBVar6->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start[type_id]->opCode;
        pBVar6 = builder(this);
        if (OVar1 == OpTypeStruct) {
          iVar3 = spv::Builder::getNumTypeConstituents(pBVar6,type_id);
          iVar10 = 0;
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          uVar9 = 0;
          for (member = 0; uVar5 = (uint)uVar9, iVar3 != member; member = member + 1) {
            pBVar6 = builder(this);
            IVar4 = spv::Builder::getContainedTypeId(pBVar6,type_id,member);
            SVar7 = get_physical_size_for_type(this,IVar4);
            uVar2 = SVar7.alignment;
            iVar10 = (-uVar2 & (uVar2 + iVar10) - 1) + SVar7.size;
            uVar8 = (ulong)SVar7 >> 0x20;
            if (uVar2 < uVar5) {
              uVar8 = uVar9;
            }
            uVar9 = uVar8;
          }
          uVar5 = -uVar5 & (uVar5 + iVar10) - 1;
          goto LAB_001159d1;
        }
        uVar9 = (ulong)((pBVar6->module).idToInstruction.
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[type_id]->opCode == OpTypePointer)
                << 3;
        goto LAB_0011592a;
      }
      IVar4 = spv::Builder::getContainedTypeId(pBVar6,type_id);
      SVar7 = get_physical_size_for_type(this,IVar4);
      uVar11 = SVar7.size;
      pBVar6 = builder(this);
      iVar3 = spv::Builder::getNumTypeConstituents(pBVar6,type_id);
    }
    uVar9 = (ulong)SVar7 >> 0x20;
    uVar5 = iVar3 * uVar11;
  }
LAB_001159d1:
  return (SizeAlignment)((ulong)uVar5 | uVar9 << 0x20);
}

Assistant:

Converter::Impl::SizeAlignment Converter::Impl::get_physical_size_for_type(spv::Id type_id)
{
	SizeAlignment res = {};

	if (builder().isScalarType(type_id))
	{
		res.size = builder().getScalarTypeWidth(type_id) / 8;
		res.alignment = res.size;
	}
	else if (builder().isVectorType(type_id))
	{
		res = get_physical_size_for_type(builder().getContainedTypeId(type_id));
		res.size *= builder().getNumComponents(type_id);
	}
	else if (builder().isArrayType(type_id))
	{
		res = get_physical_size_for_type(builder().getContainedTypeId(type_id));
		uint32_t array_size = builder().getNumTypeConstituents(type_id);
		// Alignment is inherited from constituent, we do scalar block layout here.
		res.size *= array_size;
	}
	else if (builder().isStructType(type_id))
	{
		int num_members = builder().getNumTypeConstituents(type_id);
		for (int i = 0; i < num_members; i++)
		{
			uint32_t member_type_id = builder().getContainedTypeId(type_id, i);
			auto member_res = get_physical_size_for_type(member_type_id);
			res.size = (res.size + member_res.alignment - 1) & ~(member_res.alignment - 1);
			res.size += member_res.size;
			res.alignment = std::max<uint32_t>(res.alignment, member_res.alignment);
		}
		res.size = (res.size + res.alignment - 1) & ~(res.alignment - 1);
	}
	else if (builder().isPointerType(type_id))
	{
		res.size = sizeof(uint64_t);
		res.alignment = sizeof(uint64_t);
	}

	return res;
}